

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallFilesGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallFilesGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  string *config_00;
  string local_60;
  string local_40;
  string *local_20;
  string *config_local;
  cmInstallFilesGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmInstallFilesGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)&local_40,(string *)&(this->super_cmInstallGenerator).Destination);
  config_00 = local_20;
  lg = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_60);
  cmGeneratorExpression::Evaluate
            (__return_storage_ptr__,&local_40,lg,config_00,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesGenerator::GetDestination(
  std::string const& config) const
{
  return cmGeneratorExpression::Evaluate(this->Destination,
                                         this->LocalGenerator, config);
}